

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_LoadFactor_Test
          (HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}